

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.cpp
# Opt level: O0

Preinstruction __thiscall
InstructionSet::M68k::Predecoder<(InstructionSet::M68k::Model)2>::decode6
          (Predecoder<(InstructionSet::M68k::Model)2> *this,uint16_t instruction)

{
  undefined1 local_1a;
  uint16_t instruction_local;
  Predecoder<(InstructionSet::M68k::Model)2> *this_local;
  
  local_1a = (char)instruction;
  if ((instruction & 0xf00) == 0x100) {
    if (local_1a == '\0') {
      this_local._4_4_ = decode<(unsigned_char)59,true>(this,instruction);
    }
    else if (local_1a == -1) {
      this_local._4_4_ = decode<(unsigned_char)169,true>(this,instruction);
    }
    else {
      this_local._4_4_ = decode<(unsigned_char)58,true>(this,instruction);
    }
  }
  else if (local_1a == '\0') {
    this_local._4_4_ = decode<(unsigned_char)57,true>(this,instruction);
  }
  else if (local_1a == -1) {
    this_local._4_4_ = decode<(unsigned_char)168,true>(this,instruction);
  }
  else {
    this_local._4_4_ = decode<(unsigned_char)56,true>(this,instruction);
  }
  return this_local._4_4_;
}

Assistant:

Preinstruction Predecoder<model>::decode6(uint16_t instruction) {
	using Op = Operation;

	switch(instruction & 0xf00) {
		// 4-59 (p163)
		case 0x100:
			switch(instruction & 0xff) {
				case 0x00:	Decode(Op::BSRw);
				case 0xff:
					if constexpr (model >= Model::M68020) {
						Decode(Op::BSRl);
					}
					[[fallthrough]];
				default:	Decode(Op::BSRb);
			}

		// 4-25 (p129) Bcc
		// 4-55 (p159) BRA (i.e. Bcc with cc = always)
		default:
			switch(instruction & 0xff) {
				case 0x00:	Decode(Op::Bccw);
				case 0xff:
					if constexpr (model >= Model::M68020) {
						Decode(Op::Bccl);
					}
					[[fallthrough]];
				default:	Decode(Op::Bccb);
			}
	}
}